

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_hex_char_to_int_(char c)

{
  int local_c;
  char c_local;
  
  switch(c) {
  case '0':
    local_c = 0;
    break;
  case '1':
    local_c = 1;
    break;
  case '2':
    local_c = 2;
    break;
  case '3':
    local_c = 3;
    break;
  case '4':
    local_c = 4;
    break;
  case '5':
    local_c = 5;
    break;
  case '6':
    local_c = 6;
    break;
  case '7':
    local_c = 7;
    break;
  case '8':
    local_c = 8;
    break;
  case '9':
    local_c = 9;
    break;
  default:
    local_c = -1;
    break;
  case 'A':
  case 'a':
    local_c = 10;
    break;
  case 'B':
  case 'b':
    local_c = 0xb;
    break;
  case 'C':
  case 'c':
    local_c = 0xc;
    break;
  case 'D':
  case 'd':
    local_c = 0xd;
    break;
  case 'E':
  case 'e':
    local_c = 0xe;
    break;
  case 'F':
  case 'f':
    local_c = 0xf;
  }
  return local_c;
}

Assistant:

int
evutil_hex_char_to_int_(char c)
{
	switch(c)
	{
		case '0': return 0;
		case '1': return 1;
		case '2': return 2;
		case '3': return 3;
		case '4': return 4;
		case '5': return 5;
		case '6': return 6;
		case '7': return 7;
		case '8': return 8;
		case '9': return 9;
		case 'A': case 'a': return 10;
		case 'B': case 'b': return 11;
		case 'C': case 'c': return 12;
		case 'D': case 'd': return 13;
		case 'E': case 'e': return 14;
		case 'F': case 'f': return 15;
	}
	return -1;
}